

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall SVGChart::PainterTester::Draw(PainterTester *this,Painter *inPainter)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  
  iVar3 = (*inPainter->_vptr_Painter[8])(inPainter,"The quick brown fox...");
  iVar2 = iVar3 / 10;
  iVar4 = (*inPainter->_vptr_Painter[9])(inPainter);
  uVar1 = iVar2 + iVar4 * 2;
  (**inPainter->_vptr_Painter)(inPainter);
  iVar4 = (*inPainter->_vptr_Painter[9])(inPainter);
  fVar6 = (float)(int)(iVar4 + 10U);
  (**inPainter->_vptr_Painter)((float)(int)uVar1,fVar6,(float)(int)(iVar3 + uVar1),fVar6,inPainter);
  fVar7 = (float)(int)(iVar3 + 10U);
  (**inPainter->_vptr_Painter)((float)iVar2,fVar7,(float)iVar2,0x41200000,inPainter);
  iVar5 = (*inPainter->_vptr_Painter[9])(inPainter);
  fVar6 = (float)(iVar2 + iVar5);
  (**inPainter->_vptr_Painter)(fVar6,fVar7,fVar6,0x41200000,inPainter);
  (*inPainter->_vptr_Painter[0xb])
            (0xc2b40000,inPainter,(ulong)(uint)(iVar2 + iVar5),(ulong)(iVar3 + 10U),
             "The quick brown fox...");
  (*inPainter->_vptr_Painter[10])
            (inPainter,(ulong)uVar1,(ulong)(iVar4 + 10U),"The quick brown fox...");
  return true;
}

Assistant:

bool PainterTester::Draw (Painter &inPainter) {

      const char * theString = "The quick brown fox...";
      int theWidth = inPainter.CalculateTextDrawSize (theString);
      int theOffset = theWidth/10;

      // a horizontal lines
      int theHAscent_x = theOffset+2*inPainter.GetFontHeight ();
      int theHAscent_y = 10;
      int theHAscent_w = theWidth;
      inPainter.DrawLine (theHAscent_x, theHAscent_y, theHAscent_x+theHAscent_w, theHAscent_y);

      int theHDescent_x = theHAscent_x;
      int theHDescent_y = theHAscent_y+inPainter.GetFontHeight ();
      int theHDescent_w = theHAscent_w;
      inPainter.DrawLine (theHDescent_x, theHDescent_y, theHDescent_x+theHDescent_w, theHDescent_y);
      
      // a vertical lines
      int theVAscent_x = theOffset;
      int theVAscent_y = theHAscent_y+theWidth;
      int theVAscent_h = -theWidth;
      inPainter.DrawLine (theVAscent_x, theVAscent_y, theVAscent_x, theVAscent_y+theVAscent_h);

      int theVDescent_x = theVAscent_x+inPainter.GetFontHeight ();
      int theVDescent_y = theVAscent_y;
      int theVDescent_h = theVAscent_h;
      inPainter.DrawLine (theVDescent_x, theVDescent_y, theVDescent_x, theVDescent_y+theVDescent_h);

      // Draw vertical text, followed by horizontal.
      inPainter.DrawRotatedText (theVDescent_x, theVDescent_y, -90, theString);
      inPainter.DrawText (theHDescent_x, theHDescent_y, theString);

      return true;
    }